

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Part.cpp
# Opt level: O0

void __thiscall MT32Emu::RhythmPart::refresh(RhythmPart *this)

{
  PatchCache *cache_00;
  int local_24;
  int t;
  PatchCache *cache;
  int drumTimbreNum;
  uint drumNum;
  RhythmPart *this_local;
  
  for (cache._4_4_ = 0; cache._4_4_ < ((this->super_Part).synth)->controlROMMap->rhythmSettingsCount
      ; cache._4_4_ = cache._4_4_ + 1) {
    if (this->rhythmTemp[cache._4_4_].timbre < 0x7f) {
      cache_00 = this->drumCache[cache._4_4_];
      Part::backupCacheToPartials(&this->super_Part,cache_00);
      for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
        cache_00[local_24].dirty = true;
        cache_00[local_24].reverb = this->rhythmTemp[cache._4_4_].reverbSwitch != '\0';
      }
    }
  }
  Part::updatePitchBenderRange(&this->super_Part);
  return;
}

Assistant:

void RhythmPart::refresh() {
	// (Re-)cache all the mapped timbres ahead of time
	for (unsigned int drumNum = 0; drumNum < synth->controlROMMap->rhythmSettingsCount; drumNum++) {
		int drumTimbreNum = rhythmTemp[drumNum].timbre;
		if (drumTimbreNum >= 127) { // 94 on MT-32
			continue;
		}
		PatchCache *cache = drumCache[drumNum];
		backupCacheToPartials(cache);
		for (int t = 0; t < 4; t++) {
			// Common parameters, stored redundantly
			cache[t].dirty = true;
			cache[t].reverb = rhythmTemp[drumNum].reverbSwitch > 0;
		}
	}
	updatePitchBenderRange();
}